

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O3

int64_t av1_refine_integerized_param
                  (WarpedMotionParams *wm,TransformationType wmtype,int use_hbd,int bd,uint8_t *ref,
                  int r_width,int r_height,int r_stride,uint8_t *dst,int d_width,int d_height,
                  int d_stride,int n_refinements,int64_t ref_frame_error,uint8_t *segment_map,
                  int segment_map_stride,double gm_erroradv_tr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t iVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined7 in_register_00000031;
  int iVar16;
  int iVar17;
  ulong uVar18;
  TransformationType TVar19;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,wmtype);
  uVar1 = av1_refine_integerized_param::max_trans_model_params
          [CONCAT71(in_register_00000031,wmtype) & 0xffffffff];
  if (uVar2 == 0) {
    wm->wmmat[0] = 0;
    wm->wmmat[1] = 0;
LAB_00484b3d:
    wm->wmmat[2] = 0x10000;
    wm->wmmat[3] = 0;
    iVar15 = 0;
    iVar12 = 0x10000;
  }
  else {
    if (uVar2 == 1) goto LAB_00484b3d;
    if (uVar2 != 2) {
      iVar12 = wm->wmmat[5];
      goto LAB_00484b59;
    }
    iVar12 = wm->wmmat[2];
    iVar15 = wm->wmmat[3];
  }
  wm->wmmat[4] = -iVar15;
  wm->wmmat[5] = iVar12;
LAB_00484b59:
  if ((((iVar12 == 0x10000) && (wm->wmmat[4] == 0)) && (wm->wmmat[2] == 0x10000)) &&
     (wm->wmmat[3] == 0)) {
    TVar19 = '\x01';
    if (wm->wmmat[1] == 0) {
      TVar19 = wm->wmmat[0] != 0;
    }
  }
  else if ((wm->wmmat[2] != iVar12) || (TVar19 = '\x02', wm->wmmat[3] + wm->wmmat[4] != 0)) {
    TVar19 = '\x03';
  }
  wm->wmtype = TVar19;
  iVar12 = (int)segment_map;
  if (n_refinements == 0) {
    lVar6 = lrint((double)ref_frame_error * gm_erroradv_tr);
    lVar6 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,d_width,d_height
                           ,(int)lVar6,iVar12,segment_map_stride,in_stack_ffffffffffffff88,
                           CONCAT44(bd,use_hbd),
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,r_width),
                           in_stack_ffffffffffffffa0);
  }
  else {
    lVar5 = lrint((double)ref_frame_error * 0.7);
    lVar6 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,d_width,d_height
                           ,(int)lVar5,iVar12,segment_map_stride,in_stack_ffffffffffffff88,
                           CONCAT44(bd,use_hbd),
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,r_width),
                           in_stack_ffffffffffffffa0);
    if (lVar5 < lVar6) {
      lVar6 = 0x7fffffffffffffff;
    }
    else {
      if (0 < n_refinements) {
        iVar15 = 1 << ((char)n_refinements - 1U & 0x1f);
        uVar7 = 1;
        if (1 < (int)uVar1) {
          uVar7 = (ulong)uVar1;
        }
        iVar13 = 0;
        uVar2 = uVar2 & 0xff;
        do {
          if (wmtype != '\0') {
            uVar18 = 0;
            iVar10 = lVar6;
            do {
              iVar14 = wm->wmmat[uVar18];
              uVar1 = (uint)(uVar18 == 5 || uVar18 == 2);
              iVar17 = uVar1 * 0x10000;
              bVar11 = (byte)(&DAT_005753a8)[1 < uVar18];
              iVar16 = (int)(iVar14 + uVar1 * -0x10000) >> (bVar11 & 0x1f);
              iVar3 = iVar16 - iVar15;
              if (0xfff < iVar3) {
                iVar3 = 0x1000;
              }
              if (iVar3 < -0xfff) {
                iVar3 = -0x1000;
              }
              wm->wmmat[uVar18] = (iVar3 << (bVar11 & 0x1f)) + iVar17;
              if (wmtype == '\0') {
                wm->wmmat[0] = 0;
                wm->wmmat[1] = 0;
LAB_00484d77:
                wm->wmmat[2] = 0x10000;
                wm->wmmat[3] = 0;
                iVar3 = 0;
                iVar4 = 0x10000;
LAB_00484d86:
                wm->wmmat[4] = -iVar3;
                wm->wmmat[5] = iVar4;
              }
              else {
                if (uVar2 == 1) goto LAB_00484d77;
                if (uVar2 == 2) {
                  iVar4 = wm->wmmat[2];
                  iVar3 = wm->wmmat[3];
                  goto LAB_00484d86;
                }
              }
              wm->wmtype = wmtype;
              iVar8 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,
                                     d_width,d_height,(int)iVar10,iVar12,segment_map_stride,
                                     in_stack_ffffffffffffff88,CONCAT44(bd,use_hbd),
                                     (uint8_t *)CONCAT44(iVar14,r_width),iVar15);
              lVar6 = iVar10;
              if (iVar8 < iVar10) {
                iVar14 = wm->wmmat[uVar18];
                lVar6 = iVar8;
              }
              iVar16 = iVar16 + iVar15;
              if (0xfff < iVar16) {
                iVar16 = 0x1000;
              }
              if (iVar16 < -0xfff) {
                iVar16 = -0x1000;
              }
              wm->wmmat[uVar18] = (iVar16 << (bVar11 & 0x1f)) + iVar17;
              if (wmtype == '\0') {
                wm->wmmat[0] = 0;
                wm->wmmat[1] = 0;
LAB_00484e9a:
                wm->wmmat[2] = 0x10000;
                wm->wmmat[3] = 0;
                iVar16 = 0;
                iVar4 = 0x10000;
LAB_00484ea9:
                wm->wmmat[4] = -iVar16;
                wm->wmmat[5] = iVar4;
              }
              else {
                if (uVar2 == 1) goto LAB_00484e9a;
                if (uVar2 == 2) {
                  iVar4 = wm->wmmat[2];
                  iVar16 = wm->wmmat[3];
                  goto LAB_00484ea9;
                }
              }
              wm->wmtype = wmtype;
              iVar9 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,
                                     d_width,d_height,(int)lVar6,iVar12,segment_map_stride,
                                     in_stack_ffffffffffffff88,CONCAT44(bd,use_hbd),
                                     (uint8_t *)CONCAT44(iVar14,r_width),iVar15);
              if (iVar9 < lVar6) {
                iVar14 = wm->wmmat[uVar18];
                iVar16 = 1;
                lVar6 = iVar9;
LAB_00484f2d:
                iVar16 = iVar16 * iVar15;
                do {
                  iVar3 = ((int)(iVar14 + uVar1 * -0x10000) >> (bVar11 & 0x1f)) + iVar16;
                  if (0xfff < iVar3) {
                    iVar3 = 0x1000;
                  }
                  if (iVar3 < -0xfff) {
                    iVar3 = -0x1000;
                  }
                  wm->wmmat[uVar18] = (iVar3 << (bVar11 & 0x1f)) + iVar17;
                  if (wmtype == '\0') {
                    wm->wmmat[0] = 0;
                    wm->wmmat[1] = 0;
LAB_00484f9a:
                    wm->wmmat[2] = 0x10000;
                    wm->wmmat[3] = 0;
                    iVar3 = 0;
                    iVar4 = 0x10000;
LAB_00484fa9:
                    wm->wmmat[4] = -iVar3;
                    wm->wmmat[5] = iVar4;
                  }
                  else {
                    if (uVar2 == 1) goto LAB_00484f9a;
                    if (uVar2 == 2) {
                      iVar4 = wm->wmmat[2];
                      iVar3 = wm->wmmat[3];
                      goto LAB_00484fa9;
                    }
                  }
                  wm->wmtype = wmtype;
                  iVar10 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,
                                          d_width,d_height,(int)lVar6,iVar12,segment_map_stride,
                                          in_stack_ffffffffffffff88,CONCAT44(bd,use_hbd),
                                          (uint8_t *)CONCAT44(iVar14,r_width),iVar15);
                  if (lVar6 <= iVar10) goto LAB_0048501a;
                  iVar14 = wm->wmmat[uVar18];
                  lVar6 = iVar10;
                } while( true );
              }
              iVar16 = -1;
              if (iVar8 < iVar10) goto LAB_00484f2d;
LAB_0048501a:
              wm->wmmat[uVar18] = iVar14;
              if (wmtype == '\0') {
                wm->wmmat[0] = 0;
                wm->wmmat[1] = 0;
LAB_00485058:
                wm->wmmat[2] = 0x10000;
                wm->wmmat[3] = 0;
                iVar14 = 0;
                iVar4 = 0x10000;
LAB_00485067:
                wm->wmmat[4] = -iVar14;
                wm->wmmat[5] = iVar4;
              }
              else {
                if (uVar2 == 1) goto LAB_00485058;
                if (uVar2 == 2) {
                  iVar4 = wm->wmmat[2];
                  iVar14 = wm->wmmat[3];
                  goto LAB_00485067;
                }
              }
              wm->wmtype = wmtype;
              uVar18 = uVar18 + 1;
              iVar10 = lVar6;
            } while (uVar18 != uVar7);
          }
          iVar13 = iVar13 + 1;
          iVar15 = iVar15 >> 1;
        } while (iVar13 != n_refinements);
      }
      if (((wm->wmmat[5] == 0x10000) && (wm->wmmat[4] == 0)) &&
         ((wm->wmmat[2] == 0x10000 && (wm->wmmat[3] == 0)))) {
        TVar19 = '\x01';
        if (wm->wmmat[1] == 0) {
          TVar19 = wm->wmmat[0] != 0;
        }
      }
      else if ((wm->wmmat[2] != wm->wmmat[5]) || (TVar19 = '\x02', wm->wmmat[3] + wm->wmmat[4] != 0)
              ) {
        TVar19 = '\x03';
      }
      wm->wmtype = TVar19;
      av1_get_shear_params(wm);
    }
  }
  return lVar6;
}

Assistant:

int64_t av1_refine_integerized_param(
    WarpedMotionParams *wm, TransformationType wmtype, int use_hbd, int bd,
    uint8_t *ref, int r_width, int r_height, int r_stride, uint8_t *dst,
    int d_width, int d_height, int d_stride, int n_refinements,
    int64_t ref_frame_error, uint8_t *segment_map, int segment_map_stride,
    double gm_erroradv_tr) {
  static const int max_trans_model_params[TRANS_TYPES] = { 0, 2, 4, 6 };
  const int border = ERRORADV_BORDER;
  int i = 0, p;
  int n_params = max_trans_model_params[wmtype];
  int32_t *param_mat = wm->wmmat;
  int64_t step_error, best_error;
  int32_t step;
  int32_t *param;
  int32_t curr_param;
  int32_t best_param;

  force_wmtype(wm, wmtype);
  wm->wmtype = get_wmtype(wm);

  if (n_refinements == 0) {
    // Compute the maximum error value that will be accepted, so that
    // get_warp_error can terminate early if it proves the model will not
    // be accepted.
    int64_t selection_threshold =
        (int64_t)lrint(ref_frame_error * gm_erroradv_tr);
    return get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                          dst + border * d_stride + border, d_stride, border,
                          border, d_width - 2 * border, d_height - 2 * border,
                          0, 0, selection_threshold, segment_map,
                          segment_map_stride);
  }

  // When refining, use a slightly higher threshold for the initial error
  // calculation - see comment above erroradv_early_tr for why.
  int64_t selection_threshold =
      (int64_t)lrint(ref_frame_error * erroradv_early_tr);
  best_error =
      get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                     dst + border * d_stride + border, d_stride, border, border,
                     d_width - 2 * border, d_height - 2 * border, 0, 0,
                     selection_threshold, segment_map, segment_map_stride);

  if (best_error > selection_threshold) {
    return INT64_MAX;
  }

  step = 1 << (n_refinements - 1);
  for (i = 0; i < n_refinements; i++, step >>= 1) {
    for (p = 0; p < n_params; ++p) {
      int step_dir = 0;
      param = param_mat + p;
      curr_param = *param;
      best_param = curr_param;
      // look to the left
      // Note: We have to use force_wmtype() to keep the proper symmetry for
      // ROTZOOM type models
      *param = add_param_offset(p, curr_param, -step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = -1;
      }

      // look to the right
      *param = add_param_offset(p, curr_param, step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = 1;
      }

      // look to the direction chosen above repeatedly until error increases
      // for the biggest step size
      while (step_dir) {
        *param = add_param_offset(p, best_param, step * step_dir);
        force_wmtype(wm, wmtype);
        step_error =
            get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                           dst + border * d_stride + border, d_stride, border,
                           border, d_width - 2 * border, d_height - 2 * border,
                           0, 0, best_error, segment_map, segment_map_stride);
        if (step_error < best_error) {
          best_error = step_error;
          best_param = *param;
        } else {
          step_dir = 0;
        }
      }

      // Restore best parameter value so far
      *param = best_param;
      force_wmtype(wm, wmtype);
    }
  }

  wm->wmtype = get_wmtype(wm);
  // Recompute shear params for the refined model
  // This should never fail, because we only ever consider warp-able models
  if (!av1_get_shear_params(wm)) {
    assert(0);
  }
  return best_error;
}